

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

Gia_Man_t * Abc_GenSignedBooth(int nArgN,int nArgM)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar5;
  Gia_Man_t *p_02;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long local_98;
  int local_70;
  
  uVar9 = nArgM + nArgN + 1;
  iVar10 = (nArgM - ((int)(nArgM + 1U) >> 0x1f)) + 1 >> 1;
  iVar17 = (iVar10 + 1) * uVar9;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar17 - 1U < 0xf) {
    iVar17 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar17;
  if (iVar17 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar17 << 2);
  }
  p->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < nArgN + 1U) {
    iVar17 = nArgN + 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar17;
  if (iVar17 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar17 << 2);
  }
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < nArgM + 1U) {
    iVar17 = nArgM + 2;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar17;
  if (iVar17 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar17 << 2);
  }
  p_01->pArray = piVar5;
  p_02 = Gia_ManStart(1000);
  pcVar6 = (char *)malloc(6);
  builtin_strncpy(pcVar6,"booth",6);
  p_02->pName = pcVar6;
  Vec_IntPush(p_00,0);
  iVar17 = nArgN;
  if (0 < nArgN) {
    do {
      pGVar7 = Gia_ManAppendObj(p_02);
      uVar15 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_02->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_02->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar7)) goto LAB_002d3c6b;
      Vec_IntPush(p_02->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_02->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar7)) goto LAB_002d3c6b;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  if (0 < (long)p_00->nSize) {
    Vec_IntPush(p_00,p_00->pArray[(long)p_00->nSize + -1]);
    Vec_IntPush(p_01,0);
    iVar17 = nArgM;
    if (0 < nArgM) {
      do {
        pGVar7 = Gia_ManAppendObj(p_02);
        uVar15 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar15 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar15 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_02->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_02->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar7)) {
LAB_002d3c6b:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_02->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = p_02->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + p_02->nObjs <= pGVar7)) goto LAB_002d3c6b;
        Vec_IntPush(p_01,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556);
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
    if (0 < (long)p_01->nSize) {
      uVar11 = nArgM + nArgN;
      Vec_IntPush(p_01,p_01->pArray[(long)p_01->nSize + -1]);
      if (-1 < (int)uVar11) {
        uVar15 = 0;
        do {
          iVar17 = 0;
          if ((int)((uint)(uVar15 >> 1) & 0x7fffffff) < iVar10 && (uVar15 & 1) == 0) {
            iVar17 = piVar5[uVar15 + 2];
          }
          Vec_IntPush(p,iVar17);
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
      }
      Gia_ManHashAlloc(p_02);
      if (0 < nArgM) {
        local_70 = nArgM + -1;
        uVar15 = 0;
        uVar13 = uVar15;
        do {
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            Vec_IntPush(p,0);
          }
          if (-1 < nArgN) {
            uVar15 = 0;
            do {
              uVar3 = Abc_GenSignedBoothPP
                                (p_02,piVar4[uVar15],piVar4[uVar15 + 1],piVar5[uVar13],
                                 piVar5[uVar13 | 1],piVar5[uVar13 + 2]);
              if ((int)uVar3 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar1 = uVar15 + 1;
              Vec_IntPush(p,uVar3 ^ ((uint)nArgN == uVar15 && uVar13 != 0));
              uVar15 = uVar1;
            } while (nArgN + 1U != uVar1);
          }
          if ((long)p->nSize < 1) goto LAB_002d3c8a;
          uVar3 = p->pArray[(long)p->nSize + -1];
          uVar12 = uVar3;
          if (uVar13 != 0) {
            uVar12 = 1;
          }
          Vec_IntPush(p,uVar12);
          iVar17 = nArgN + 2 + (int)uVar13;
          if (iVar17 <= (int)uVar11) {
            iVar14 = iVar17;
            iVar18 = local_70;
            do {
              if ((iVar14 <= iVar17 && uVar13 == 0) && ((int)uVar3 < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x131,"int Abc_LitNot(int)");
              }
              uVar12 = 0;
              if (iVar14 <= iVar17 && uVar13 == 0) {
                uVar12 = uVar3 ^ 1;
              }
              Vec_IntPush(p,uVar12);
              iVar14 = iVar14 + 1;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar15 = uVar13 + 2;
          local_70 = local_70 + -2;
          uVar13 = uVar15;
        } while (uVar15 < (uint)(iVar10 * 2));
      }
      Gia_ManHashStop(p_02);
      if (-3 < nArgM) {
        local_98 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        uVar15 = 0;
        iVar17 = 0;
        do {
          uVar13 = (ulong)uVar11;
          lVar16 = local_98;
          iVar14 = iVar17;
          if (0 < (int)uVar11) {
            do {
              if ((iVar17 < 0) || (p->nSize <= iVar14)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              Gia_ManAppendCo(p_02,*(int *)((long)p->pArray + lVar16));
              uVar13 = uVar13 - 1;
              lVar16 = lVar16 + 4;
              iVar14 = iVar14 + 1;
            } while (uVar13 != 0);
          }
          uVar15 = uVar15 + 1;
          iVar17 = iVar17 + uVar9;
          local_98 = local_98 + (ulong)uVar9 * 4;
        } while (uVar15 != iVar10 + 1);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
      }
      free(p_01);
      pGVar8 = Gia_ManCleanup(p_02);
      Gia_ManStop(p_02);
      return pGVar8;
    }
  }
LAB_002d3c8a:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Abc_GenSignedBooth( int nArgN, int nArgM )
{
    int nWidth = nArgN + nArgM + 1;
    int Length = (nArgM + 1) / 2;
    int i, k, iLit;

    Vec_Int_t * vPPs  = Vec_IntAlloc( nWidth * (Length + 1) );
    Vec_Int_t * vArgN = Vec_IntAlloc( nArgN + 2 );
    Vec_Int_t * vArgM = Vec_IntAlloc( nArgM + 2 );
    int * pArgN = Vec_IntArray( vArgN );
    int * pArgM = Vec_IntArray( vArgM );

    Gia_Man_t * pTemp, * pNew; 
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );

    Vec_IntPush( vArgN, 0 );
    for ( i = 0; i < nArgN; i++ )
        Vec_IntPush( vArgN, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgN, Vec_IntEntryLast(vArgN) );

    Vec_IntPush( vArgM, 0 );
    for ( i = 0; i < nArgM; i++ )
        Vec_IntPush( vArgM, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgM, Vec_IntEntryLast(vArgM) );

    for ( i = 0; i < nWidth; i++ )
        Vec_IntPush( vPPs, (i%2 == 0 && i/2 < Length) ? pArgM[i+2] : 0 );

    Gia_ManHashAlloc( pNew );
    for ( k = 0; k < 2*Length; k += 2 )
    {
        for ( i = 0; i < k; i++ )
            Vec_IntPush( vPPs, 0 );
        for ( i = 0; i <= nArgN; i++ )
        {
            iLit = Abc_GenSignedBoothPP( pNew, pArgN[i], pArgN[i+1], pArgM[k], pArgM[k+1], pArgM[k+2] );
            Vec_IntPush( vPPs, Abc_LitNotCond( iLit, k > 0 && i == nArgN ) );
        }
        iLit = Vec_IntEntryLast(vPPs);
        Vec_IntPush( vPPs, k > 0 ? 1 : iLit );
        for ( i = k+nArgN+2; i < nWidth; i++ )
            Vec_IntPush( vPPs, (k > 0 || i > k+nArgN+2) ? 0 : Abc_LitNot(iLit) );
    }
    Gia_ManHashStop( pNew );

    for ( k = 0; k <= Length; k++ )
        for ( i = 0; i < nArgN+nArgM; i++ )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vPPs, k*(nArgN+nArgM+1) + i) );
    Vec_IntFree( vPPs );
    Vec_IntFree( vArgN );
    Vec_IntFree( vArgM );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}